

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O3

void __thiscall getarg_tests::stringarg::test_method(stringarg *this)

{
  long lVar1;
  int iVar2;
  long lVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long *plVar6;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  lazy_ostream local_3c8;
  undefined1 *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_380;
  char **local_368;
  string *local_360;
  char *local_358;
  char *local_350;
  assertion_result local_348;
  string local_330;
  string local_310;
  string local_2f0;
  undefined1 local_2d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  uint local_2b0;
  string local_2a8 [16];
  long local_298 [2];
  undefined4 local_288;
  ArgsManager local_args;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&local_args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"-foo",(allocator<char> *)&local_3c8);
  local_2b0 = 1;
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"-bar",(allocator<char> *)&local_3c8)
  ;
  local_288 = 1;
  __l._M_len = 2;
  __l._M_array = (iterator)local_2d0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_380,__l,(allocator_type *)&local_3c8);
  SetupArgs(&local_args,&local_380);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_380);
  lVar3 = -0x50;
  plVar6 = local_298;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -5;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  local_2d0._0_8_ = &local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"","");
  ResetArgs(&local_args,(string *)local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._0_8_ != &local_2c0) {
    operator_delete((void *)local_2d0._0_8_,local_2c0._M_allocated_capacity + 1);
  }
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xdf;
  file.m_begin = (iterator)&local_398;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_3a8,msg);
  local_3c8.m_empty = false;
  local_3c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_3b8 = boost::unit_test::lazy_ostream::inst;
  local_3b0 = "";
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"-foo","");
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"","");
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_2f0,"");
  local_348.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_348.m_message.px = (element_type *)0x0;
  local_348.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_350 = "";
  local_2c0._8_8_ = &local_360;
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_368 = &local_388;
  local_388 = "";
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389558;
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_360 = &local_2f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_348,&local_3c8,1,2,REQUIRE,0xe743db,(size_t)&local_358,0xdf,(string *)local_2d0,
             "\"\"",&local_380);
  boost::detail::shared_count::~shared_count(&local_348.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xe0;
  file_00.m_begin = (iterator)&local_3d8;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3e8,
             msg_00);
  local_3c8.m_empty = false;
  local_3c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_3b8 = boost::unit_test::lazy_ostream::inst;
  local_3b0 = "";
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"-foo","");
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"eleven","");
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_2f0,"eleven");
  local_348.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_348.m_message.px = (element_type *)0x0;
  local_348.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_350 = "";
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c0._8_8_ = &local_360;
  local_388 = "eleven";
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389008;
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_368 = &local_388;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_360 = &local_2f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_348,&local_3c8,1,2,REQUIRE,0xe743f9,(size_t)&local_358,0xe0,(string *)local_2d0,
             "\"eleven\"",&local_380);
  boost::detail::shared_count::~shared_count(&local_348.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  local_2d0._0_8_ = &local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"-foo -bar","");
  ResetArgs(&local_args,(string *)local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._0_8_ != &local_2c0) {
    operator_delete((void *)local_2d0._0_8_,(ulong)(local_2c0._M_allocated_capacity + 1));
  }
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xe3;
  file_01.m_begin = (iterator)&local_3f8;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_408,
             msg_01);
  local_3c8.m_empty = false;
  local_3c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_3b8 = boost::unit_test::lazy_ostream::inst;
  local_3b0 = "";
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"-foo","");
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"","");
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_2f0,"");
  local_348.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_348.m_message.px = (element_type *)0x0;
  local_348.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_350 = "";
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c0._8_8_ = &local_360;
  local_388 = "";
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389558;
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_368 = &local_388;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_360 = &local_2f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_348,&local_3c8,1,2,REQUIRE,0xe743db,(size_t)&local_358,0xe3,(string *)local_2d0,
             "\"\"",&local_380);
  boost::detail::shared_count::~shared_count(&local_348.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xe4;
  file_02.m_begin = (iterator)&local_418;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_428,
             msg_02);
  local_3c8.m_empty = false;
  local_3c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_3b8 = boost::unit_test::lazy_ostream::inst;
  local_3b0 = "";
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"-foo","");
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"eleven","");
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_2f0,"");
  local_348.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_348.m_message.px = (element_type *)0x0;
  local_348.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_350 = "";
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c0._8_8_ = &local_360;
  local_388 = "";
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389558;
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_368 = &local_388;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_360 = &local_2f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_348,&local_3c8,1,2,REQUIRE,0xe743f9,(size_t)&local_358,0xe4,(string *)local_2d0,
             "\"\"",&local_380);
  boost::detail::shared_count::~shared_count(&local_348.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  local_2d0._0_8_ = &local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"-foo=","");
  ResetArgs(&local_args,(string *)local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._0_8_ != &local_2c0) {
    operator_delete((void *)local_2d0._0_8_,(ulong)(local_2c0._M_allocated_capacity + 1));
  }
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xe7;
  file_03.m_begin = (iterator)&local_438;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_448,
             msg_03);
  local_3c8.m_empty = false;
  local_3c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_3b8 = boost::unit_test::lazy_ostream::inst;
  local_3b0 = "";
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"-foo","");
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"","");
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_2f0,"");
  local_348.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_348.m_message.px = (element_type *)0x0;
  local_348.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_350 = "";
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c0._8_8_ = &local_360;
  local_388 = "";
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389558;
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_368 = &local_388;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_360 = &local_2f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_348,&local_3c8,1,2,REQUIRE,0xe743db,(size_t)&local_358,0xe7,(string *)local_2d0,
             "\"\"",&local_380);
  boost::detail::shared_count::~shared_count(&local_348.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xe8;
  file_04.m_begin = (iterator)&local_458;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_468,
             msg_04);
  local_3c8.m_empty = false;
  local_3c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_3b8 = boost::unit_test::lazy_ostream::inst;
  local_3b0 = "";
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"-foo","");
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"eleven","");
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_2f0,"");
  local_348.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_348.m_message.px = (element_type *)0x0;
  local_348.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_350 = "";
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c0._8_8_ = &local_360;
  local_388 = "";
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389558;
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_368 = &local_388;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_360 = &local_2f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_348,&local_3c8,1,2,REQUIRE,0xe743f9,(size_t)&local_358,0xe8,(string *)local_2d0,
             "\"\"",&local_380);
  boost::detail::shared_count::~shared_count(&local_348.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  local_2d0._0_8_ = &local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"-foo=11","");
  ResetArgs(&local_args,(string *)local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._0_8_ != &local_2c0) {
    operator_delete((void *)local_2d0._0_8_,(ulong)(local_2c0._M_allocated_capacity + 1));
  }
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xeb;
  file_05.m_begin = (iterator)&local_478;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_488,
             msg_05);
  local_3c8.m_empty = false;
  local_3c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_3b8 = boost::unit_test::lazy_ostream::inst;
  local_3b0 = "";
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"-foo","");
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"");
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_2f0,"11");
  local_348.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_348.m_message.px = (element_type *)0x0;
  local_348.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_350 = "";
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c0._8_8_ = &local_360;
  local_388 = "11";
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0138a6b0;
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_368 = &local_388;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_360 = &local_2f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_348,&local_3c8,1,2,REQUIRE,0xe743db,(size_t)&local_358,0xeb,local_2d0,"\"11\"",
             &local_380);
  boost::detail::shared_count::~shared_count(&local_348.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xec;
  file_06.m_begin = (iterator)&local_498;
  msg_06.m_end = pvVar5;
  msg_06.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_4a8,
             msg_06);
  local_3c8.m_empty = false;
  local_3c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_3b8 = boost::unit_test::lazy_ostream::inst;
  local_3b0 = "";
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"-foo","");
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"eleven","");
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_2f0,"11");
  local_348.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_348.m_message.px = (element_type *)0x0;
  local_348.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_350 = "";
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c0._8_8_ = &local_360;
  local_388 = "11";
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0138a6b0;
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_368 = &local_388;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_360 = &local_2f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_348,&local_3c8,1,2,REQUIRE,0xe743f9,(size_t)&local_358,0xec,local_2d0,"\"11\"",
             &local_380);
  boost::detail::shared_count::~shared_count(&local_348.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  local_2d0._0_8_ = &local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"-foo=eleven","");
  ResetArgs(&local_args,(string *)local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._0_8_ != &local_2c0) {
    operator_delete((void *)local_2d0._0_8_,(ulong)(local_2c0._M_allocated_capacity + 1));
  }
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xef;
  file_07.m_begin = (iterator)&local_4b8;
  msg_07.m_end = pvVar5;
  msg_07.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4c8,
             msg_07);
  local_3c8.m_empty = false;
  local_3c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_3b8 = boost::unit_test::lazy_ostream::inst;
  local_3b0 = "";
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"-foo","");
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"","");
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_2f0,"eleven");
  local_348.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_348.m_message.px = (element_type *)0x0;
  local_348.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_350 = "";
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c0._8_8_ = &local_360;
  local_388 = "eleven";
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389008;
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_368 = &local_388;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_360 = &local_2f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_348,&local_3c8,1,2,REQUIRE,0xe743db,(size_t)&local_358,0xef,(string *)local_2d0,
             "\"eleven\"",&local_380);
  boost::detail::shared_count::~shared_count(&local_348.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xf0;
  file_08.m_begin = (iterator)&local_4d8;
  msg_08.m_end = pvVar5;
  msg_08.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_4e8,
             msg_08);
  local_3c8.m_empty = false;
  local_3c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_3b8 = boost::unit_test::lazy_ostream::inst;
  local_3b0 = "";
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"-foo","");
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"eleven","");
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_2f0,"eleven");
  local_348.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_348.m_message.px = (element_type *)0x0;
  local_348.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_350 = "";
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c0._8_8_ = &local_360;
  local_388 = "eleven";
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389008;
  local_380.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_368 = &local_388;
  local_360 = &local_2f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_348,&local_3c8,1,2,REQUIRE,0xe743f9,(size_t)&local_358,0xf0,(string *)local_2d0,
             "\"eleven\"",&local_380);
  boost::detail::shared_count::~shared_count(&local_348.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  ArgsManager::~ArgsManager(&local_args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(stringarg)
{
    ArgsManager local_args;

    const auto foo = std::make_pair("-foo", ArgsManager::ALLOW_ANY);
    const auto bar = std::make_pair("-bar", ArgsManager::ALLOW_ANY);
    SetupArgs(local_args, {foo, bar});
    ResetArgs(local_args, "");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", ""), "");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", "eleven"), "eleven");

    ResetArgs(local_args, "-foo -bar");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", ""), "");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", "eleven"), "");

    ResetArgs(local_args, "-foo=");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", ""), "");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", "eleven"), "");

    ResetArgs(local_args, "-foo=11");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", ""), "11");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", "eleven"), "11");

    ResetArgs(local_args, "-foo=eleven");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", ""), "eleven");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", "eleven"), "eleven");
}